

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O2

int amqp_decode_field_value
              (amqp_bytes_t encoded,amqp_pool_t *pool,amqp_field_value_t *entry,size_t *offset)

{
  uint8_t uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  size_t o;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  int local_54;
  
  pvVar5 = encoded.bytes;
  uVar9 = encoded.len;
  sVar10 = *offset;
  uVar8 = sVar10 + 1;
  *offset = uVar8;
  iVar4 = -2;
  if (uVar9 < uVar8) {
    return -2;
  }
  uVar1 = *(uint8_t *)((long)pvVar5 + sVar10);
  entry->kind = uVar1;
  switch(uVar1) {
  case 'A':
    sVar10 = *offset;
    uVar8 = sVar10 + 4;
    *offset = uVar8;
    if (uVar9 < uVar8) {
      return -2;
    }
    uVar3 = *(uint *)((long)pvVar5 + sVar10);
    pvVar5 = malloc(0x180);
    if (pvVar5 == (void *)0x0) {
      return -1;
    }
    uVar11 = (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) +
             uVar8;
    local_54 = 0x10;
    lVar12 = 0;
    uVar9 = 0;
    while (iVar4 = -1, uVar8 < uVar11) {
      pvVar6 = pvVar5;
      if ((long)local_54 <= (long)uVar9) {
        local_54 = local_54 * 2;
        pvVar6 = realloc(pvVar5,(long)local_54 * 0x18);
        if (pvVar6 == (void *)0x0) goto LAB_0010ab04;
      }
      pvVar5 = pvVar6;
      iVar4 = amqp_decode_field_value
                        (encoded,pool,(amqp_field_value_t *)((long)pvVar5 + lVar12),offset);
      if (iVar4 < 0) goto LAB_0010ab04;
      uVar9 = uVar9 + 1;
      lVar12 = lVar12 + 0x18;
      uVar8 = *offset;
    }
    (entry->value).boolean = (amqp_boolean_t)uVar9;
    sVar10 = (uVar9 & 0xffffffff) * 0x18;
    pvVar6 = amqp_pool_alloc(pool,sVar10);
    (entry->value).bytes.bytes = pvVar6;
    if (pvVar6 != (void *)0x0 || uVar9 == 0) {
      memcpy(pvVar6,pvVar5,sVar10);
      iVar4 = 0;
    }
LAB_0010ab04:
    free(pvVar5);
    return iVar4;
  case 'B':
switchD_0010a86a_caseD_62:
    sVar10 = *offset;
    uVar8 = sVar10 + 1;
    *offset = uVar8;
    if (uVar9 < uVar8) {
      return -2;
    }
    (entry->value).i8 = *(int8_t *)((long)pvVar5 + sVar10);
    break;
  case 'C':
  case 'E':
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'U':
    goto switchD_0010a86a_caseD_63;
  case 'D':
    sVar10 = *offset;
    uVar8 = sVar10 + 1;
    *offset = uVar8;
    if (uVar9 < uVar8) {
      return -2;
    }
    (entry->value).i8 = *(int8_t *)((long)pvVar5 + sVar10);
    sVar10 = *offset;
    uVar8 = sVar10 + 4;
    *offset = uVar8;
    if (uVar9 < uVar8) {
      return -2;
    }
    uVar3 = *(uint *)((long)pvVar5 + sVar10);
    (entry->value).decimal.value =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    break;
  case 'F':
    iVar4 = amqp_decode_table(encoded,pool,&(entry->value).table,offset);
    return iVar4;
  case 'I':
switchD_0010a86a_caseD_66:
    sVar10 = *offset;
    uVar8 = sVar10 + 4;
    *offset = uVar8;
    if (uVar9 < uVar8) {
      return -2;
    }
    uVar3 = *(uint *)((long)pvVar5 + sVar10);
    (entry->value).u32 =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    break;
  case 'L':
  case 'T':
switchD_0010a86a_caseD_64:
    sVar10 = *offset;
    uVar8 = sVar10 + 8;
    *offset = uVar8;
    if (uVar9 < uVar8) {
      return -2;
    }
    uVar8 = *(ulong *)((long)pvVar5 + sVar10);
    (entry->value).u64 =
         uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
         (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
         (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
    break;
  case 'S':
switchD_0010a8a3_caseD_53:
    sVar10 = *offset;
    uVar8 = sVar10 + 4;
    *offset = uVar8;
    if (uVar9 < uVar8) {
      return -2;
    }
    uVar3 = *(uint *)((long)pvVar5 + sVar10);
    uVar7 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18)
    ;
    uVar11 = uVar8 + uVar7;
    *offset = uVar11;
    if (uVar9 < uVar11) {
      return -2;
    }
    (entry->value).bytes.bytes = (void *)((long)pvVar5 + uVar8);
    (entry->value).i64 = uVar7;
    break;
  case 'V':
    break;
  default:
    switch(uVar1) {
    case 'b':
      goto switchD_0010a86a_caseD_62;
    case 'c':
    case 'e':
    case 'g':
    case 'h':
    case 'j':
    case 'k':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
      goto switchD_0010a86a_caseD_63;
    case 'd':
    case 'l':
      goto switchD_0010a86a_caseD_64;
    case 'f':
    case 'i':
      goto switchD_0010a86a_caseD_66;
    case 's':
    case 'u':
      sVar10 = *offset;
      uVar8 = sVar10 + 2;
      *offset = uVar8;
      if (uVar9 < uVar8) {
        return -2;
      }
      uVar2 = *(ushort *)((long)pvVar5 + sVar10);
      (entry->value).u16 = uVar2 << 8 | uVar2 >> 8;
      break;
    case 't':
      sVar10 = *offset;
      uVar8 = sVar10 + 1;
      *offset = uVar8;
      if (uVar9 < uVar8) {
        return -2;
      }
      *(uint *)&entry->value = (uint)(*(char *)((long)pvVar5 + sVar10) != '\0');
      break;
    default:
      if (uVar1 != 'x') {
        return -2;
      }
      goto switchD_0010a8a3_caseD_53;
    }
  }
  iVar4 = 0;
switchD_0010a86a_caseD_63:
  return iVar4;
}

Assistant:

static int amqp_decode_field_value(amqp_bytes_t encoded,
                                   amqp_pool_t *pool,
                                   amqp_field_value_t *entry,
                                   size_t *offset)
{
  int res = AMQP_STATUS_BAD_AMQP_DATA;

  if (!amqp_decode_8(encoded, offset, &entry->kind)) {
    goto out;
  }

#define TRIVIAL_FIELD_DECODER(bits) if (!amqp_decode_##bits(encoded, offset, &entry->value.u##bits)) goto out; break
#define SIMPLE_FIELD_DECODER(bits, dest, how) { uint##bits##_t val; if (!amqp_decode_##bits(encoded, offset, &val)) goto out; entry->value.dest = how; } break

  switch (entry->kind) {
  case AMQP_FIELD_KIND_BOOLEAN:
    SIMPLE_FIELD_DECODER(8, boolean, val ? 1 : 0);

  case AMQP_FIELD_KIND_I8:
    SIMPLE_FIELD_DECODER(8, i8, (int8_t)val);
  case AMQP_FIELD_KIND_U8:
    TRIVIAL_FIELD_DECODER(8);

  case AMQP_FIELD_KIND_I16:
    SIMPLE_FIELD_DECODER(16, i16, (int16_t)val);
  case AMQP_FIELD_KIND_U16:
    TRIVIAL_FIELD_DECODER(16);

  case AMQP_FIELD_KIND_I32:
    SIMPLE_FIELD_DECODER(32, i32, (int32_t)val);
  case AMQP_FIELD_KIND_U32:
    TRIVIAL_FIELD_DECODER(32);

  case AMQP_FIELD_KIND_I64:
    SIMPLE_FIELD_DECODER(64, i64, (int64_t)val);
  case AMQP_FIELD_KIND_U64:
    TRIVIAL_FIELD_DECODER(64);

  case AMQP_FIELD_KIND_F32:
    TRIVIAL_FIELD_DECODER(32);
    /* and by punning, f32 magically gets the right value...! */

  case AMQP_FIELD_KIND_F64:
    TRIVIAL_FIELD_DECODER(64);
    /* and by punning, f64 magically gets the right value...! */

  case AMQP_FIELD_KIND_DECIMAL:
    if (!amqp_decode_8(encoded, offset, &entry->value.decimal.decimals)
        || !amqp_decode_32(encoded, offset, &entry->value.decimal.value)) {
      goto out;
    }
    break;

  case AMQP_FIELD_KIND_UTF8:
    /* AMQP_FIELD_KIND_UTF8 and AMQP_FIELD_KIND_BYTES have the
       same implementation, but different interpretations. */
    /* fall through */
  case AMQP_FIELD_KIND_BYTES: {
    uint32_t len;
    if (!amqp_decode_32(encoded, offset, &len)
        || !amqp_decode_bytes(encoded, offset, &entry->value.bytes, len)) {
      goto out;
    }
    break;
  }

  case AMQP_FIELD_KIND_ARRAY:
    res = amqp_decode_array(encoded, pool, &(entry->value.array), offset);
    goto out;

  case AMQP_FIELD_KIND_TIMESTAMP:
    TRIVIAL_FIELD_DECODER(64);

  case AMQP_FIELD_KIND_TABLE:
    res = amqp_decode_table(encoded, pool, &(entry->value.table), offset);
    goto out;

  case AMQP_FIELD_KIND_VOID:
    break;

  default:
    goto out;
  }

  res = AMQP_STATUS_OK;

out:
  return res;
}